

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsequentialanimationgroup.cpp
# Opt level: O3

void QSequentialAnimationGroup::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  QObjectData *pQVar2;
  QBindingStatus *pQVar3;
  __atomic_base<int> _Var4;
  undefined8 *puVar5;
  long in_FS_OFFSET;
  undefined8 local_30;
  void *local_28;
  undefined8 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QSequentialAnimationGroupPrivate::_q_uncontrolledAnimationFinished
                  ((QSequentialAnimationGroupPrivate *)(_o->d_ptr).d);
        return;
      }
      goto LAB_003af424;
    }
    if (_id == 0) {
      local_30 = *_a[1];
      local_20 = &local_30;
      local_28 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_28);
    }
    break;
  case ReadProperty:
    if (_id == 0) {
      puVar5 = (undefined8 *)*_a;
      pQVar2 = (_o->d_ptr).d;
      pQVar3 = (pQVar2->bindingStorage).bindingStatus;
      if ((pQVar3 != (QBindingStatus *)0x0) &&
         (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper
                  (&pQVar2->bindingStorage,(QUntypedPropertyData *)&pQVar2[2].children);
      }
      *puVar5 = pQVar2[2].children.d.d;
    }
    break;
  default:
    if (_c == BindableProperty && _id == 0) {
      plVar1 = (long *)*_a;
      *plVar1 = (long)&(_o->d_ptr).d[2].children;
      plVar1[1] = (long)&QtPrivate::
                         QBindableInterfaceForProperty<const_QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>,_void>
                         ::iface;
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == currentAnimationChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    break;
  case RegisterPropertyMetaType:
    if (_id == 0) {
      _Var4._M_i = (__int_type_conflict)
                   QtPrivate::QMetaTypeInterfaceWrapper<QAbstractAnimation_*>::metaType.typeId.
                   _q_value.super___atomic_base<int>._M_i;
      if ((__atomic_base<int>)
          QtPrivate::QMetaTypeInterfaceWrapper<QAbstractAnimation_*>::metaType.typeId._q_value.
          super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
        _Var4._M_i = QMetaType::registerHelper
                               (&QtPrivate::QMetaTypeInterfaceWrapper<QAbstractAnimation_*>::
                                 metaType);
      }
      ((__atomic_base<int> *)*_a)->_M_i = _Var4._M_i;
    }
    else {
      *(undefined4 *)*_a = 0xffffffff;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 0) {
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractAnimation_*>::metaType;
        break;
      }
    }
    else {
      puVar5 = (undefined8 *)*_a;
    }
    *puVar5 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003af424:
  __stack_chk_fail();
}

Assistant:

void QSequentialAnimationGroup::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSequentialAnimationGroup *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentAnimationChanged((*reinterpret_cast< std::add_pointer_t<QAbstractAnimation*>>(_a[1]))); break;
        case 1: _t->d_func()->_q_uncontrolledAnimationFinished(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractAnimation* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSequentialAnimationGroup::*)(QAbstractAnimation * )>(_a, &QSequentialAnimationGroup::currentAnimationChanged, 0))
            return;
    }
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 0:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QAbstractAnimation* >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QAbstractAnimation**>(_v) = _t->currentAnimation(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableCurrentAnimation(); break;
        default: break;
        }
    }
}